

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::FlushAndResetBuffer
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  uint8_t *puVar1;
  uint uVar2;
  
  if ((this->had_error_ != true) && (uVar2 = Flush(this,ptr), this->had_error_ != true)) {
    if (0x10 < (int)uVar2) {
      puVar1 = this->buffer_end_;
      this->end_ = puVar1 + ((ulong)uVar2 - 0x10);
      this->buffer_end_ = (uint8_t *)0x0;
      return puVar1;
    }
    this->end_ = this->buffer_ + (int)uVar2;
    return this->buffer_;
  }
  return this->buffer_;
}

Assistant:

uint8_t* EpsCopyOutputStream::FlushAndResetBuffer(uint8_t* ptr) {
  if (had_error_) return buffer_;
  int s = Flush(ptr);
  if (had_error_) return buffer_;
  return SetInitialBuffer(buffer_end_, s);
}